

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)46>,toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>>
::invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)46>,toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc)

{
  const_iterator rollback;
  value_type *pvVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_R8;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_b8;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  rollback._M_current = *(char **)(this + 0x40);
  maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>
  ::invoke<std::__cxx11::string>
            (&local_b8,
             (maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>
              *)this,loc);
  if (local_b8.is_ok_ == false) {
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    pvVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&local_b8);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
              ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68,pvVar1);
    sequence<toml::detail::character<(char)46>,toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>>
    ::invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,
               (sequence<toml::detail::character<(char)46>,toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>>
                *)this,&local_68,
               (region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)rollback._M_current,in_R8);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68);
  }
  if (local_b8.is_ok_ == true) {
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region(&local_b8.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto first = loc.iter();
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        return sequence<Tail...>::invoke(loc, std::move(rslt.unwrap()), first);
    }